

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

float32_t bf_get_float32_le(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  
  uVar1 = bf_get_uint8(bfile);
  uVar2 = bf_get_uint8(bfile);
  uVar3 = bf_get_uint8(bfile);
  uVar4 = bf_get_uint8(bfile);
  return (float32_t)CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

float32_t
bf_get_float32_le(
    bfile_t * bfile )
{
    union {
        float32_t  real;
        uint8_t    bytes[4];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}